

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Parser *__return_storage_ptr___00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator local_278a;
  allocator local_2789;
  allocator local_2788;
  allocator local_2787;
  allocator local_2786;
  allocator local_2785;
  allocator local_2784;
  allocator local_2783;
  allocator local_2782;
  allocator local_2781;
  allocator local_2780;
  allocator local_277f;
  allocator local_277e;
  allocator local_277d;
  allocator local_277c;
  allocator local_277b;
  allocator local_277a;
  allocator local_2779;
  allocator local_2778;
  allocator local_2777;
  allocator local_2776;
  allocator local_2775;
  allocator local_2774;
  allocator local_2773;
  allocator local_2772;
  allocator local_2771;
  allocator local_2770;
  allocator local_276f;
  allocator local_276e;
  allocator local_276d;
  allocator local_276c;
  allocator local_276b;
  allocator local_276a;
  allocator local_2769;
  allocator local_2768;
  allocator local_2767;
  allocator local_2766;
  allocator local_2765;
  allocator local_2764;
  allocator local_2763;
  allocator local_2762;
  allocator local_2761;
  allocator local_2760;
  allocator local_275f;
  allocator local_275e;
  allocator local_275d;
  allocator local_275c;
  allocator local_275b;
  allocator local_275a;
  allocator local_2759;
  allocator local_2758;
  allocator local_2757;
  allocator local_2756;
  allocator local_2755;
  allocator local_2754;
  allocator local_2753;
  allocator local_2752;
  allocator local_2751;
  allocator local_2750;
  allocator local_274f;
  allocator local_274e;
  allocator local_274d;
  allocator local_274c;
  allocator local_274b;
  allocator local_274a;
  allocator local_2749;
  allocator local_2748;
  allocator local_2747;
  allocator local_2746;
  allocator local_2745;
  allocator local_2744;
  allocator local_2743;
  allocator local_2742;
  allocator local_2741;
  allocator local_2740;
  allocator local_273f;
  allocator local_273e;
  allocator local_273d;
  allocator local_273c;
  allocator local_273b;
  allocator local_273a;
  allocator local_2739;
  allocator local_2738;
  allocator local_2737;
  allocator local_2736;
  allocator local_2735;
  allocator local_2734;
  allocator local_2733;
  allocator local_2732;
  allocator local_2731;
  allocator local_2730;
  allocator local_272f;
  allocator local_272e;
  allocator local_272d;
  allocator local_272c;
  allocator local_272b;
  allocator local_272a;
  allocator local_2729;
  Parser *local_2728;
  string local_2720 [32];
  string local_2700;
  string local_26e0 [32];
  value_type local_26c0;
  string local_26a0;
  string local_2680 [32];
  value_type local_2660;
  string local_2640 [32];
  value_type local_2620;
  string local_2600;
  string local_25e0 [32];
  value_type local_25c0;
  string local_25a0;
  string local_2580 [32];
  value_type local_2560;
  string local_2540;
  string local_2520 [32];
  value_type local_2500;
  string local_24e0 [32];
  string local_24c0 [32];
  value_type local_24a0;
  string local_2480 [32];
  value_type local_2460;
  string local_2440 [32];
  string local_2420 [32];
  value_type local_2400;
  string local_23e0 [32];
  string local_23c0 [32];
  value_type local_23a0;
  string local_2380 [32];
  string local_2360 [32];
  value_type local_2340;
  string local_2320 [32];
  value_type local_2300;
  string local_22e0 [32];
  value_type local_22c0;
  value_type local_22a0;
  string local_2280 [32];
  string local_2260 [32];
  value_type local_2240;
  value_type local_2220;
  string local_2200;
  string local_21e0 [32];
  value_type local_21c0;
  value_type local_21a0;
  string local_2180 [32];
  value_type local_2160;
  value_type local_2140;
  string local_2120 [32];
  string local_2100 [32];
  value_type local_20e0;
  value_type local_20c0;
  string local_20a0;
  string local_2080 [32];
  value_type local_2060;
  value_type local_2040;
  string local_2020 [32];
  string local_2000 [32];
  value_type local_1fe0;
  value_type local_1fc0;
  string local_1fa0 [32];
  string local_1f80 [32];
  value_type local_1f60;
  value_type local_1f40;
  string local_1f20 [32];
  string local_1f00 [32];
  value_type local_1ee0;
  value_type local_1ec0;
  string local_1ea0 [32];
  value_type local_1e80;
  value_type local_1e60;
  string local_1e40;
  string local_1e20 [32];
  value_type local_1e00;
  value_type local_1de0;
  string local_1dc0 [32];
  string local_1da0 [32];
  value_type local_1d80;
  value_type local_1d60;
  string local_1d40;
  string local_1d20 [32];
  value_type local_1d00;
  value_type local_1ce0;
  string local_1cc0 [32];
  value_type local_1ca0;
  value_type local_1c80;
  string local_1c60 [32];
  value_type local_1c40;
  value_type local_1c20;
  string local_1c00 [32];
  value_type local_1be0;
  value_type local_1bc0;
  string local_1ba0 [32];
  value_type local_1b80;
  value_type local_1b60;
  string local_1b40 [32];
  value_type local_1b20;
  value_type local_1b00;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1ad8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1ad0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1ac8;
  string local_1ac0 [32];
  _Alloc_hider local_1aa0;
  size_type local_1a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a80;
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a50;
  string local_1a48 [32];
  _Alloc_hider local_1a28;
  size_type local_1a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a08;
  __allocator_type __a2_8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_19e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_19e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19d8;
  string local_19d0 [32];
  _Alloc_hider local_19b0;
  size_type local_19a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1990;
  undefined1 local_1978 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1970;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1968;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1960;
  string local_1958 [32];
  _Alloc_hider local_1938;
  size_type local_1930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1918;
  __allocator_type __a2_3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18e8;
  string local_18e0 [32];
  _Alloc_hider local_18c0;
  size_type local_18b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18a0;
  undefined1 local_1888 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1880;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1878;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1870;
  string local_1868 [32];
  _Alloc_hider local_1848;
  size_type local_1840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1838;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1828;
  ExeName local_1810;
  undefined1 local_17e8 [8];
  pointer local_17e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_17d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_17d0;
  string local_17c8 [32];
  _Alloc_hider local_17a8;
  size_type local_17a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1798;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1788;
  __allocator_type __a2_6;
  string local_1750 [32];
  _Alloc_hider local_1730;
  size_type local_1728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1720;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1710;
  __allocator_type __a2_5;
  string local_16d8 [32];
  _Alloc_hider local_16b8;
  size_type local_16b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1698;
  undefined1 local_1680 [64];
  _Alloc_hider local_1640;
  size_type local_1638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1630;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1620;
  __allocator_type __a2_7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1600 [7];
  string local_15c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15a8;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1588 [7];
  string local_1550 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1530;
  __allocator_type __a2_9;
  string local_14d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b8;
  __allocator_type __a2_4;
  string local_1460 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1440;
  __allocator_type __a2_10;
  string local_13e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13c8;
  undefined1 local_13b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_13a8 [7];
  string local_1370 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1350;
  undefined1 local_1338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1330 [7];
  string local_12f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d8;
  undefined1 local_12c0 [64];
  string local_1280 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1260;
  undefined1 local_1248 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1240 [7];
  string local_1208 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11e8;
  undefined1 local_11d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_11c8 [7];
  string local_1190 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1170;
  undefined1 local_1158 [64];
  string local_1118 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10f8;
  undefined1 local_10e0 [96];
  undefined1 local_1080 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1020;
  undefined1 local_1008 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fa8;
  undefined1 local_f90 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f30;
  undefined1 local_f18 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_eb8;
  undefined1 local_ea0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e40;
  undefined1 local_e28 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc8;
  undefined1 local_db0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d50;
  undefined1 local_d38 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cd8;
  undefined1 local_cc0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c60;
  Parser local_c48;
  Parser local_be8;
  Parser local_b88;
  Parser local_b28;
  Parser local_ac8;
  Parser local_a68;
  Parser local_a08;
  Parser local_9a8;
  Parser local_948;
  Parser local_8e8;
  Parser local_888;
  Parser local_828;
  Parser local_7c8;
  Parser local_768;
  Parser local_708;
  Parser local_6a8;
  Parser local_648;
  Parser local_5e8;
  Parser local_588;
  Parser local_528;
  Parser local_4c8;
  Parser local_468;
  Parser local_408;
  Parser local_3a8;
  Parser local_348;
  Parser local_2e8;
  Parser local_288;
  Parser local_228;
  Parser local_1c8;
  Parser local_168;
  Parser local_108;
  Opt local_a8;
  
  clara::detail::ExeName::ExeName(&local_1810,&config->processName);
  clara::detail::Help::Help((Help *)&local_a8,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_c48,&local_1810.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             (Help *)&local_a8);
  clara::detail::Opt::Opt((Opt *)local_cc0,&config->listTests);
  std::__cxx11::string::string((string *)&local_1b00,"-l",&local_2729);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c60,&local_1b00);
  std::__cxx11::string::string((string *)&local_1b20,"--list-tests",&local_272a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c60,&local_1b20);
  std::__cxx11::string::string(local_1b40,"list all/matching test cases",&local_272b);
  std::__cxx11::string::_M_assign((string *)(local_cc0 + 0x40));
  clara::detail::Parser::operator|(&local_be8,&local_c48,(Opt *)local_cc0);
  clara::detail::Opt::Opt((Opt *)local_d38,&config->listTags);
  std::__cxx11::string::string((string *)&local_1b60,"-t",&local_272c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cd8,&local_1b60);
  std::__cxx11::string::string((string *)&local_1b80,"--list-tags",&local_272d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cd8,&local_1b80);
  std::__cxx11::string::string(local_1ba0,"list all/matching tags",&local_272e);
  std::__cxx11::string::_M_assign((string *)(local_d38 + 0x40));
  clara::detail::Parser::operator|(&local_b88,&local_be8,(Opt *)local_d38);
  clara::detail::Opt::Opt((Opt *)local_db0,&config->showSuccessfulTests);
  std::__cxx11::string::string((string *)&local_1bc0,"-s",&local_272f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d50,&local_1bc0);
  std::__cxx11::string::string((string *)&local_1be0,"--success",&local_2730);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d50,&local_1be0);
  std::__cxx11::string::string(local_1c00,"include successful tests in output",&local_2731);
  std::__cxx11::string::_M_assign((string *)(local_db0 + 0x40));
  clara::detail::Parser::operator|(&local_b28,&local_b88,(Opt *)local_db0);
  clara::detail::Opt::Opt((Opt *)local_e28,&config->shouldDebugBreak);
  std::__cxx11::string::string((string *)&local_1c20,"-b",&local_2732);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_dc8,&local_1c20);
  std::__cxx11::string::string((string *)&local_1c40,"--break",&local_2733);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_dc8,&local_1c40);
  std::__cxx11::string::string(local_1c60,"break into debugger on failure",&local_2734);
  std::__cxx11::string::_M_assign((string *)(local_e28 + 0x40));
  clara::detail::Parser::operator|(&local_ac8,&local_b28,(Opt *)local_e28);
  clara::detail::Opt::Opt((Opt *)local_ea0,&config->noThrow);
  std::__cxx11::string::string((string *)&local_1c80,"-e",&local_2735);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e40,&local_1c80);
  std::__cxx11::string::string((string *)&local_1ca0,"--nothrow",&local_2736);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e40,&local_1ca0);
  std::__cxx11::string::string(local_1cc0,"skip exception tests",&local_2737);
  std::__cxx11::string::_M_assign((string *)(local_ea0 + 0x40));
  clara::detail::Parser::operator|(&local_a68,&local_ac8,(Opt *)local_ea0);
  clara::detail::Opt::Opt((Opt *)local_f18,&config->showInvisibles);
  std::__cxx11::string::string((string *)&local_1ce0,"-i",&local_2738);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_eb8,&local_1ce0);
  std::__cxx11::string::string((string *)&local_1d00,"--invisibles",&local_2739);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_eb8,&local_1d00);
  std::__cxx11::string::string(local_1d20,"show invisibles (tabs, newlines)",&local_273a);
  std::__cxx11::string::_M_assign((string *)(local_f18 + 0x40));
  clara::detail::Parser::operator|(&local_a08,&local_a68,(Opt *)local_f18);
  std::__cxx11::string::string((string *)&local_1d40,"filename",&local_273b);
  clara::detail::Opt::Opt<std::__cxx11::string>
            ((Opt *)local_f90,&config->outputFilename,&local_1d40);
  std::__cxx11::string::string((string *)&local_1d60,"-o",&local_273c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f30,&local_1d60);
  std::__cxx11::string::string((string *)&local_1d80,"--out",&local_273d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f30,&local_1d80);
  std::__cxx11::string::string(local_1da0,"output filename",&local_273e);
  std::__cxx11::string::_M_assign((string *)(local_f90 + 0x40));
  clara::detail::Parser::operator|(&local_9a8,&local_a08,(Opt *)local_f90);
  std::__cxx11::string::string(local_1dc0,"name",&local_273f);
  local_1680._0_8_ = &PTR__ParserRefImpl_00199800;
  local_1680._8_4_ = Optional;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1158._0_8_ = &__a2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198860;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001988b0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  local_1158._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9799:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9799:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9799:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9799:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1158);
  local_11d0 = (undefined1  [8])0x0;
  a_Stack_11c8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1680._16_8_ = p_Var1 + 1;
  local_1680._24_8_ = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_11c8);
  std::__cxx11::string::string((string *)(local_1680 + 0x20),local_1dc0);
  local_1640._M_p = (pointer)&local_1630;
  local_1638 = 0;
  local_1630._M_local_buf[0] = '\0';
  local_1680._0_8_ = &PTR__Opt_00199710;
  local_1620.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1620.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1620.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1de0,"-r",&local_2740);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1620,&local_1de0);
  std::__cxx11::string::string((string *)&local_1e00,"--reporter",&local_2741);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1620,&local_1e00);
  std::__cxx11::string::string(local_1e20,"reporter to use (defaults to console)",&local_2742);
  std::__cxx11::string::_M_assign((string *)&local_1640);
  clara::detail::Parser::operator|(&local_948,&local_9a8,(Opt *)local_1680);
  std::__cxx11::string::string((string *)&local_1e40,"name",&local_2743);
  clara::detail::Opt::Opt<std::__cxx11::string>((Opt *)local_1158,&config->name,&local_1e40);
  std::__cxx11::string::string((string *)&local_1e60,"-n",&local_2744);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10f8,&local_1e60);
  std::__cxx11::string::string((string *)&local_1e80,"--name",&local_2745);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10f8,&local_1e80);
  std::__cxx11::string::string(local_1ea0,"suite name",&local_2746);
  std::__cxx11::string::_M_assign(local_1118);
  clara::detail::Parser::operator|(&local_8e8,&local_948,(Opt *)local_1158);
  local_2728 = __return_storage_ptr__;
  p_Var2 = (pointer)operator_new(0x20);
  ___a2 = (undefined **)&__a2_1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00198900;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_00198950;
  *(ConfigData **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = config;
  local_1ad8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9842:20)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9842:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9842:20)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9842:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2);
  local_1888 = (undefined1  [8])0x0;
  _Stack_1880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ___a2 = (undefined **)&p_Var2->_M_impl;
  local_1ad8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_11d0,
             (shared_ptr<Catch::clara::detail::BoundRef> *)&__a2);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1ad8);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1880);
  local_11d0 = (undefined1  [8])&PTR__Opt_00199710;
  local_1170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1170.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1ec0,"-a",&local_2747);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1170,&local_1ec0);
  std::__cxx11::string::string((string *)&local_1ee0,"--abort",&local_2748);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1170,&local_1ee0);
  std::__cxx11::string::string(local_1f00,"abort at first failure",&local_2749);
  std::__cxx11::string::_M_assign(local_1190);
  clara::detail::Parser::operator|(&local_888,&local_8e8,(Opt *)local_11d0);
  std::__cxx11::string::string(local_1f20,"no. failures",&local_274a);
  ___a2 = &PTR__ParserRefImpl_00199800;
  local_1ad8._M_pi = local_1ad8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1888 = (undefined1  [8])&__a2_2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001989a0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001989f0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_1880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9845:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9845:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9845:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9845:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1888);
  ___a2_1 = (_func_int **)0x0;
  _Stack_1a60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1ad0 = p_Var1 + 1;
  local_1ac8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a60);
  std::__cxx11::string::string(local_1ac0,local_1f20);
  local_1aa0._M_p = (pointer)&local_1a90;
  local_1a98 = 0;
  local_1a90._M_local_buf[0] = '\0';
  ___a2 = &PTR__Opt_00199710;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1f40,"-x",&local_274b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a80,&local_1f40);
  std::__cxx11::string::string((string *)&local_1f60,"--abortx",&local_274c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a80,&local_1f60);
  std::__cxx11::string::string(local_1f80,"abort after x failures",&local_274d);
  std::__cxx11::string::_M_assign((string *)&local_1aa0);
  clara::detail::Parser::operator|(&local_828,&local_888,(Opt *)&__a2);
  std::__cxx11::string::string(local_1fa0,"warning name",&local_274e);
  local_1888 = (undefined1  [8])&PTR__ParserRefImpl_00199800;
  _Stack_1880._M_pi = _Stack_1880._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_1 = (undefined **)&__a2_3;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198a40;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198a90;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_1a60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9706:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9706:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9706:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9706:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_1);
  ___a2_2 = (_func_int **)0x0;
  a_Stack_1588[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1878 = p_Var1 + 1;
  local_1870._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1588);
  std::__cxx11::string::string(local_1868,local_1fa0);
  local_1848._M_p = (pointer)&local_1838;
  local_1840 = 0;
  local_1838._M_local_buf[0] = '\0';
  local_1888 = (undefined1  [8])&PTR__Opt_00199710;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1fc0,"-w",&local_274f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1828,&local_1fc0);
  std::__cxx11::string::string((string *)&local_1fe0,"--warn",&local_2750);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1828,&local_1fe0);
  std::__cxx11::string::string(local_2000,"enable warnings",&local_2751);
  std::__cxx11::string::_M_assign((string *)&local_1848);
  clara::detail::Parser::operator|(&local_7c8,&local_828,(Opt *)local_1888);
  std::__cxx11::string::string(local_2020,"yes|no",&local_2752);
  ___a2_1 = &PTR__ParserRefImpl_00199800;
  _Stack_1a60._M_pi = _Stack_1a60._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_2 = (_func_int **)&__a2_4;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198ae0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198b30;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_1588[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9851:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9851:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9851:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9851:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_2);
  ___a2_3 = (_func_int **)0x0;
  _Stack_18f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a58 = p_Var1 + 1;
  local_1a50._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18f8);
  std::__cxx11::string::string(local_1a48,local_2020);
  local_1a28._M_p = (pointer)&local_1a18;
  local_1a20 = 0;
  local_1a18._M_local_buf[0] = '\0';
  ___a2_1 = &PTR__Opt_00199710;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2040,"-d",&local_2753);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a08,&local_2040);
  std::__cxx11::string::string((string *)&local_2060,"--durations",&local_2754);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a08,&local_2060);
  std::__cxx11::string::string(local_2080,"show test durations",&local_2755);
  std::__cxx11::string::_M_assign((string *)&local_1a28);
  clara::detail::Parser::operator|(&local_768,&local_7c8,(Opt *)&__a2_1);
  std::__cxx11::string::string((string *)&local_20a0,"seconds",&local_2756);
  clara::detail::Opt::Opt<double>((Opt *)&__a2_2,&config->minDuration,&local_20a0);
  std::__cxx11::string::string((string *)&local_20c0,"-D",&local_2757);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1530,&local_20c0);
  std::__cxx11::string::string((string *)&local_20e0,"--min-duration",&local_2758);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1530,&local_20e0);
  std::__cxx11::string::string
            (local_2100,"show test durations for tests taking at least the given number of seconds",
             &local_2759);
  std::__cxx11::string::_M_assign(local_1550);
  clara::detail::Parser::operator|(&local_708,&local_768,(Opt *)&__a2_2);
  std::__cxx11::string::string(local_2120,"filename",&local_275a);
  ___a2_3 = &PTR__ParserRefImpl_00199800;
  _Stack_18f8._M_pi = _Stack_18f8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_4 = (_func_int **)&__a2_5;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198b80;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198bd0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9722:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9722:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9722:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9722:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_4);
  local_1248 = (undefined1  [8])0x0;
  a_Stack_1240[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18f0 = p_Var1 + 1;
  local_18e8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1240);
  std::__cxx11::string::string(local_18e0,local_2120);
  local_18c0._M_p = (pointer)&local_18b0;
  local_18b8 = 0;
  local_18b0._M_local_buf[0] = '\0';
  ___a2_3 = &PTR__Opt_00199710;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2140,"-f",&local_275b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18a0,&local_2140);
  std::__cxx11::string::string((string *)&local_2160,"--input-file",&local_275c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18a0,&local_2160);
  std::__cxx11::string::string(local_2180,"load test names to run from a file",&local_275d);
  std::__cxx11::string::_M_assign((string *)&local_18c0);
  clara::detail::Parser::operator|(&local_6a8,&local_708,(Opt *)&__a2_3);
  clara::detail::Opt::Opt((Opt *)&__a2_4,&config->filenamesAsTags);
  std::__cxx11::string::string((string *)&local_21a0,"-#",&local_275e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1440,&local_21a0);
  std::__cxx11::string::string((string *)&local_21c0,"--filenames-as-tags",&local_275f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1440,&local_21c0);
  std::__cxx11::string::string(local_21e0,"adds a tag for the filename",&local_2760);
  std::__cxx11::string::_M_assign(local_1460);
  clara::detail::Parser::operator|(&local_648,&local_6a8,(Opt *)&__a2_4);
  std::__cxx11::string::string((string *)&local_2200,"section name",&local_2761);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Opt *)local_1248,&config->sectionsToRun,&local_2200);
  std::__cxx11::string::string((string *)&local_2220,"-c",&local_2762);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11e8,&local_2220);
  std::__cxx11::string::string((string *)&local_2240,"--section",&local_2763);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11e8,&local_2240);
  std::__cxx11::string::string(local_2260,"specify section to run",&local_2764);
  std::__cxx11::string::_M_assign(local_1208);
  clara::detail::Parser::operator|(&local_5e8,&local_648,(Opt *)local_1248);
  std::__cxx11::string::string(local_2280,"quiet|normal|high",&local_2765);
  ___a2_5 = &PTR__ParserRefImpl_00199800;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_12c0._0_8_ = &__a2_6;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00198c20;
  puVar3[2] = &PTR__BoundRef_00198c70;
  puVar3[3] = config;
  local_12c0._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9787:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9787:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9787:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9787:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_12c0);
  local_1338 = (undefined1  [8])0x0;
  a_Stack_1330[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1330);
  std::__cxx11::string::string(local_16d8,local_2280);
  local_16b8._M_p = (pointer)&local_16a8;
  local_16b0 = 0;
  local_16a8._M_local_buf[0] = '\0';
  ___a2_5 = &PTR__Opt_00199710;
  local_1698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_22a0,"-v",&local_2766);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1698,&local_22a0);
  std::__cxx11::string::string((string *)&local_22c0,"--verbosity",&local_2767);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1698,&local_22c0);
  std::__cxx11::string::string(local_22e0,"set output verbosity",&local_2768);
  std::__cxx11::string::_M_assign((string *)&local_16b8);
  clara::detail::Parser::operator|(&local_588,&local_5e8,(Opt *)&__a2_5);
  clara::detail::Opt::Opt((Opt *)local_12c0,&config->listTestNamesOnly);
  std::__cxx11::string::string((string *)&local_2300,"--list-test-names-only",&local_2769);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1260,&local_2300);
  std::__cxx11::string::string(local_2320,"list all/matching test cases names only",&local_276a);
  std::__cxx11::string::_M_assign(local_1280);
  clara::detail::Parser::operator|(&local_528,&local_588,(Opt *)local_12c0);
  clara::detail::Opt::Opt((Opt *)local_1338,&config->listReporters);
  std::__cxx11::string::string((string *)&local_2340,"--list-reporters",&local_276b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12d8,&local_2340);
  std::__cxx11::string::string(local_2360,"list all reporters",&local_276c);
  std::__cxx11::string::_M_assign(local_12f8);
  clara::detail::Parser::operator|(&local_4c8,&local_528,(Opt *)local_1338);
  std::__cxx11::string::string(local_2380,"decl|lex|rand",&local_276d);
  ___a2_6 = &PTR__ParserRefImpl_00199800;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_17e8 = (undefined1  [8])&__a2_7;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00198cc0;
  puVar3[2] = &PTR__BoundRef_00198d10;
  puVar3[3] = config;
  local_17e0 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9743:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9743:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9743:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9743:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_17e8);
  local_1978 = (undefined1  [8])0x0;
  _Stack_1970._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1970);
  std::__cxx11::string::string(local_1750,local_2380);
  local_1730._M_p = (pointer)&local_1720;
  local_1728 = 0;
  local_1720._M_local_buf[0] = '\0';
  ___a2_6 = &PTR__Opt_00199710;
  local_1710.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1710.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1710.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_23a0,"--order",&local_276e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1710,&local_23a0);
  std::__cxx11::string::string(local_23c0,"test case order (defaults to decl)",&local_276f);
  std::__cxx11::string::_M_assign((string *)&local_1730);
  clara::detail::Parser::operator|(&local_468,&local_4c8,(Opt *)&__a2_6);
  std::__cxx11::string::string(local_23e0,"\'time\'|number",&local_2770);
  local_17e8 = (undefined1  [8])&PTR__ParserRefImpl_00199800;
  local_17e0 = (pointer)((ulong)local_17e0 & 0xffffffff00000000);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1978 = (undefined1  [8])&__a2_8;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198d60;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198db0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_1970._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9754:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9754:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9754:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9754:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1978);
  ___a2_7 = (_func_int **)0x0;
  a_Stack_1600[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_17d8 = p_Var1 + 1;
  local_17d0._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1600);
  std::__cxx11::string::string(local_17c8,local_23e0);
  local_17a8._M_p = (pointer)&local_1798;
  local_17a0 = 0;
  local_1798._M_local_buf[0] = '\0';
  local_17e8 = (undefined1  [8])&PTR__Opt_00199710;
  local_1788.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1788.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1788.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2400,"--rng-seed",&local_2771);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1788,&local_2400);
  std::__cxx11::string::string(local_2420,"set a specific seed for random numbers",&local_2772);
  std::__cxx11::string::_M_assign((string *)&local_17a8);
  clara::detail::Parser::operator|(&local_408,&local_468,(Opt *)local_17e8);
  std::__cxx11::string::string(local_2440,"yes|no",&local_2773);
  local_1978 = (undefined1  [8])&PTR__ParserRefImpl_00199800;
  _Stack_1970._M_pi = _Stack_1970._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_7 = (_func_int **)&__a2_9;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198e00;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198e50;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_1600[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9760:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9760:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9760:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9760:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_7);
  ___a2_8 = (_func_int **)0x0;
  _Stack_19e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1968 = p_Var1 + 1;
  local_1960._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_19e8);
  std::__cxx11::string::string(local_1958,local_2440);
  local_1938._M_p = (pointer)&local_1928;
  local_1930 = 0;
  local_1928._M_local_buf[0] = '\0';
  local_1978 = (undefined1  [8])&PTR__Opt_00199710;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2460,"--use-colour",&local_2774);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1918,&local_2460);
  std::__cxx11::string::string(local_2480,"should output be colourised",&local_2775);
  std::__cxx11::string::_M_assign((string *)&local_1938);
  clara::detail::Parser::operator|(&local_3a8,&local_408,(Opt *)local_1978);
  clara::detail::Opt::Opt((Opt *)&__a2_7,&config->libIdentify);
  std::__cxx11::string::string((string *)&local_24a0,"--libidentify",&local_2776);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15a8,&local_24a0);
  std::__cxx11::string::string
            (local_24c0,"report name and version according to libidentify standard",&local_2777);
  std::__cxx11::string::_M_assign(local_15c8);
  clara::detail::Parser::operator|(&local_348,&local_3a8,(Opt *)&__a2_7);
  std::__cxx11::string::string(local_24e0,"never|start|exit|both",&local_2778);
  ___a2_8 = &PTR__ParserRefImpl_00199800;
  _Stack_19e8._M_pi = _Stack_19e8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_9 = (_func_int **)&__a2_10;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198ea0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00198ef0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9773:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp:9773:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9773:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_0neblock[P]Arduino_SNMP_tests_catch_hpp:9773:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_9);
  local_13b0 = (undefined1  [8])0x0;
  a_Stack_13a8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_19e0 = p_Var1 + 1;
  local_19d8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_13a8);
  std::__cxx11::string::string(local_19d0,local_24e0);
  local_19b0._M_p = (pointer)&local_19a0;
  local_19a8 = 0;
  local_19a0._M_local_buf[0] = '\0';
  ___a2_8 = &PTR__Opt_00199710;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2500,"--wait-for-keypress",&local_2779);
  __return_storage_ptr___00 = local_2728;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1990,&local_2500);
  std::__cxx11::string::string(local_2520,"waits for a keypress before exiting",&local_277a);
  std::__cxx11::string::_M_assign((string *)&local_19b0);
  clara::detail::Parser::operator|(&local_2e8,&local_348,(Opt *)&__a2_8);
  std::__cxx11::string::string((string *)&local_2540,"samples",&local_277b);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)&__a2_9,&config->benchmarkSamples,&local_2540);
  std::__cxx11::string::string((string *)&local_2560,"--benchmark-samples",&local_277c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14b8,&local_2560);
  std::__cxx11::string::string(local_2580,"number of samples to collect (default: 100)",&local_277d)
  ;
  std::__cxx11::string::_M_assign(local_14d8);
  clara::detail::Parser::operator|(&local_288,&local_2e8,(Opt *)&__a2_9);
  std::__cxx11::string::string((string *)&local_25a0,"resamples",&local_277e);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)local_13b0,&config->benchmarkResamples,&local_25a0);
  std::__cxx11::string::string((string *)&local_25c0,"--benchmark-resamples",&local_277f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1350,&local_25c0);
  std::__cxx11::string::string
            (local_25e0,"number of resamples for the bootstrap (default: 100000)",&local_2780);
  std::__cxx11::string::_M_assign(local_1370);
  clara::detail::Parser::operator|(&local_228,&local_288,(Opt *)local_13b0);
  std::__cxx11::string::string((string *)&local_2600,"confidence interval",&local_2781);
  clara::detail::Opt::Opt<double>((Opt *)&__a2_10,&config->benchmarkConfidenceInterval,&local_2600);
  std::__cxx11::string::string((string *)&local_2620,"--benchmark-confidence-interval",&local_2782);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13c8,&local_2620);
  std::__cxx11::string::string
            (local_2640,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_2783);
  std::__cxx11::string::_M_assign(local_13e8);
  clara::detail::Parser::operator|(&local_1c8,&local_228,(Opt *)&__a2_10);
  clara::detail::Opt::Opt((Opt *)local_1008,&config->benchmarkNoAnalysis);
  std::__cxx11::string::string((string *)&local_2660,"--benchmark-no-analysis",&local_2784);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fa8,&local_2660);
  std::__cxx11::string::string
            (local_2680,"perform only measurements; do not perform any analysis",&local_2785);
  std::__cxx11::string::_M_assign((string *)(local_1008 + 0x40));
  clara::detail::Parser::operator|(&local_168,&local_1c8,(Opt *)local_1008);
  std::__cxx11::string::string((string *)&local_26a0,"benchmarkWarmupTime",&local_2786);
  clara::detail::Opt::Opt<long>((Opt *)local_1080,&config->benchmarkWarmupTime,&local_26a0);
  std::__cxx11::string::string((string *)&local_26c0,"--benchmark-warmup-time",&local_2787);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1020,&local_26c0);
  std::__cxx11::string::string
            (local_26e0,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_2788);
  std::__cxx11::string::_M_assign((string *)(local_1080 + 0x40));
  clara::detail::Parser::operator|(&local_108,&local_168,(Opt *)local_1080);
  std::__cxx11::string::string((string *)&local_2700,"test name|pattern|tags",&local_2789);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            ((Arg *)local_10e0,&config->testsOrTags,&local_2700);
  std::__cxx11::string::string(local_2720,"which test or tests to use",&local_278a);
  std::__cxx11::string::_M_assign((string *)(local_10e0 + 0x40));
  clara::detail::Parser::operator|(__return_storage_ptr___00,&local_108,(Arg *)local_10e0);
  std::__cxx11::string::~string(local_2720);
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::~ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Arg> *)local_10e0);
  std::__cxx11::string::~string((string *)&local_2700);
  clara::detail::Parser::~Parser(&local_108);
  std::__cxx11::string::~string(local_26e0);
  std::__cxx11::string::~string((string *)&local_26c0);
  clara::detail::Opt::~Opt((Opt *)local_1080);
  std::__cxx11::string::~string((string *)&local_26a0);
  clara::detail::Parser::~Parser(&local_168);
  std::__cxx11::string::~string(local_2680);
  std::__cxx11::string::~string((string *)&local_2660);
  clara::detail::Opt::~Opt((Opt *)local_1008);
  clara::detail::Parser::~Parser(&local_1c8);
  std::__cxx11::string::~string(local_2640);
  std::__cxx11::string::~string((string *)&local_2620);
  clara::detail::Opt::~Opt((Opt *)&__a2_10);
  std::__cxx11::string::~string((string *)&local_2600);
  clara::detail::Parser::~Parser(&local_228);
  std::__cxx11::string::~string(local_25e0);
  std::__cxx11::string::~string((string *)&local_25c0);
  clara::detail::Opt::~Opt((Opt *)local_13b0);
  std::__cxx11::string::~string((string *)&local_25a0);
  clara::detail::Parser::~Parser(&local_288);
  std::__cxx11::string::~string(local_2580);
  std::__cxx11::string::~string((string *)&local_2560);
  clara::detail::Opt::~Opt((Opt *)&__a2_9);
  std::__cxx11::string::~string((string *)&local_2540);
  clara::detail::Parser::~Parser(&local_2e8);
  std::__cxx11::string::~string(local_2520);
  std::__cxx11::string::~string((string *)&local_2500);
  clara::detail::Opt::~Opt((Opt *)&__a2_8);
  std::__cxx11::string::~string(local_24e0);
  clara::detail::Parser::~Parser(&local_348);
  std::__cxx11::string::~string(local_24c0);
  std::__cxx11::string::~string((string *)&local_24a0);
  clara::detail::Opt::~Opt((Opt *)&__a2_7);
  clara::detail::Parser::~Parser(&local_3a8);
  std::__cxx11::string::~string(local_2480);
  std::__cxx11::string::~string((string *)&local_2460);
  clara::detail::Opt::~Opt((Opt *)local_1978);
  std::__cxx11::string::~string(local_2440);
  clara::detail::Parser::~Parser(&local_408);
  std::__cxx11::string::~string(local_2420);
  std::__cxx11::string::~string((string *)&local_2400);
  clara::detail::Opt::~Opt((Opt *)local_17e8);
  std::__cxx11::string::~string(local_23e0);
  clara::detail::Parser::~Parser(&local_468);
  std::__cxx11::string::~string(local_23c0);
  std::__cxx11::string::~string((string *)&local_23a0);
  clara::detail::Opt::~Opt((Opt *)&__a2_6);
  std::__cxx11::string::~string(local_2380);
  clara::detail::Parser::~Parser(&local_4c8);
  std::__cxx11::string::~string(local_2360);
  std::__cxx11::string::~string((string *)&local_2340);
  clara::detail::Opt::~Opt((Opt *)local_1338);
  clara::detail::Parser::~Parser(&local_528);
  std::__cxx11::string::~string(local_2320);
  std::__cxx11::string::~string((string *)&local_2300);
  clara::detail::Opt::~Opt((Opt *)local_12c0);
  clara::detail::Parser::~Parser(&local_588);
  std::__cxx11::string::~string(local_22e0);
  std::__cxx11::string::~string((string *)&local_22c0);
  std::__cxx11::string::~string((string *)&local_22a0);
  clara::detail::Opt::~Opt((Opt *)&__a2_5);
  std::__cxx11::string::~string(local_2280);
  clara::detail::Parser::~Parser(&local_5e8);
  std::__cxx11::string::~string(local_2260);
  std::__cxx11::string::~string((string *)&local_2240);
  std::__cxx11::string::~string((string *)&local_2220);
  clara::detail::Opt::~Opt((Opt *)local_1248);
  std::__cxx11::string::~string((string *)&local_2200);
  clara::detail::Parser::~Parser(&local_648);
  std::__cxx11::string::~string(local_21e0);
  std::__cxx11::string::~string((string *)&local_21c0);
  std::__cxx11::string::~string((string *)&local_21a0);
  clara::detail::Opt::~Opt((Opt *)&__a2_4);
  clara::detail::Parser::~Parser(&local_6a8);
  std::__cxx11::string::~string(local_2180);
  std::__cxx11::string::~string((string *)&local_2160);
  std::__cxx11::string::~string((string *)&local_2140);
  clara::detail::Opt::~Opt((Opt *)&__a2_3);
  std::__cxx11::string::~string(local_2120);
  clara::detail::Parser::~Parser(&local_708);
  std::__cxx11::string::~string(local_2100);
  std::__cxx11::string::~string((string *)&local_20e0);
  std::__cxx11::string::~string((string *)&local_20c0);
  clara::detail::Opt::~Opt((Opt *)&__a2_2);
  std::__cxx11::string::~string((string *)&local_20a0);
  clara::detail::Parser::~Parser(&local_768);
  std::__cxx11::string::~string(local_2080);
  std::__cxx11::string::~string((string *)&local_2060);
  std::__cxx11::string::~string((string *)&local_2040);
  clara::detail::Opt::~Opt((Opt *)&__a2_1);
  std::__cxx11::string::~string(local_2020);
  clara::detail::Parser::~Parser(&local_7c8);
  std::__cxx11::string::~string(local_2000);
  std::__cxx11::string::~string((string *)&local_1fe0);
  std::__cxx11::string::~string((string *)&local_1fc0);
  clara::detail::Opt::~Opt((Opt *)local_1888);
  std::__cxx11::string::~string(local_1fa0);
  clara::detail::Parser::~Parser(&local_828);
  std::__cxx11::string::~string(local_1f80);
  std::__cxx11::string::~string((string *)&local_1f60);
  std::__cxx11::string::~string((string *)&local_1f40);
  clara::detail::Opt::~Opt((Opt *)&__a2);
  std::__cxx11::string::~string(local_1f20);
  clara::detail::Parser::~Parser(&local_888);
  std::__cxx11::string::~string(local_1f00);
  std::__cxx11::string::~string((string *)&local_1ee0);
  std::__cxx11::string::~string((string *)&local_1ec0);
  clara::detail::Opt::~Opt((Opt *)local_11d0);
  clara::detail::Parser::~Parser(&local_8e8);
  std::__cxx11::string::~string(local_1ea0);
  std::__cxx11::string::~string((string *)&local_1e80);
  std::__cxx11::string::~string((string *)&local_1e60);
  clara::detail::Opt::~Opt((Opt *)local_1158);
  std::__cxx11::string::~string((string *)&local_1e40);
  clara::detail::Parser::~Parser(&local_948);
  std::__cxx11::string::~string(local_1e20);
  std::__cxx11::string::~string((string *)&local_1e00);
  std::__cxx11::string::~string((string *)&local_1de0);
  clara::detail::Opt::~Opt((Opt *)local_1680);
  std::__cxx11::string::~string(local_1dc0);
  clara::detail::Parser::~Parser(&local_9a8);
  std::__cxx11::string::~string(local_1da0);
  std::__cxx11::string::~string((string *)&local_1d80);
  std::__cxx11::string::~string((string *)&local_1d60);
  clara::detail::Opt::~Opt((Opt *)local_f90);
  std::__cxx11::string::~string((string *)&local_1d40);
  clara::detail::Parser::~Parser(&local_a08);
  std::__cxx11::string::~string(local_1d20);
  std::__cxx11::string::~string((string *)&local_1d00);
  std::__cxx11::string::~string((string *)&local_1ce0);
  clara::detail::Opt::~Opt((Opt *)local_f18);
  clara::detail::Parser::~Parser(&local_a68);
  std::__cxx11::string::~string(local_1cc0);
  std::__cxx11::string::~string((string *)&local_1ca0);
  std::__cxx11::string::~string((string *)&local_1c80);
  clara::detail::Opt::~Opt((Opt *)local_ea0);
  clara::detail::Parser::~Parser(&local_ac8);
  std::__cxx11::string::~string(local_1c60);
  std::__cxx11::string::~string((string *)&local_1c40);
  std::__cxx11::string::~string((string *)&local_1c20);
  clara::detail::Opt::~Opt((Opt *)local_e28);
  clara::detail::Parser::~Parser(&local_b28);
  std::__cxx11::string::~string(local_1c00);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::__cxx11::string::~string((string *)&local_1bc0);
  clara::detail::Opt::~Opt((Opt *)local_db0);
  clara::detail::Parser::~Parser(&local_b88);
  std::__cxx11::string::~string(local_1ba0);
  std::__cxx11::string::~string((string *)&local_1b80);
  std::__cxx11::string::~string((string *)&local_1b60);
  clara::detail::Opt::~Opt((Opt *)local_d38);
  clara::detail::Parser::~Parser(&local_be8);
  std::__cxx11::string::~string(local_1b40);
  std::__cxx11::string::~string((string *)&local_1b20);
  std::__cxx11::string::~string((string *)&local_1b00);
  clara::detail::Opt::~Opt((Opt *)local_cc0);
  clara::detail::Parser::~Parser(&local_c48);
  clara::detail::Opt::~Opt(&local_a8);
  clara::detail::ExeName::~ExeName(&local_1810);
  return __return_storage_ptr___00;
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }